

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doc_comment.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::WriteServiceDocComment
          (java *this,Printer *printer,ServiceDescriptor *service,Options *options)

{
  char *pcVar1;
  void *pvVar2;
  Options options_00;
  bool bVar3;
  java *this_00;
  string_view text;
  string_view text_00;
  string_view input;
  SourceLocation location;
  undefined4 uVar4;
  undefined2 uVar5;
  undefined2 in_stack_fffffffffffffece;
  undefined1 *puVar6;
  long in_stack_fffffffffffffed8;
  long in_stack_fffffffffffffee0;
  undefined8 in_stack_fffffffffffffee8;
  undefined1 *puVar7;
  long in_stack_fffffffffffffef8;
  long in_stack_ffffffffffffff00;
  undefined8 in_stack_ffffffffffffff08;
  undefined2 uVar8;
  undefined2 in_stack_ffffffffffffff12;
  undefined4 in_stack_ffffffffffffff14;
  long *local_e0 [2];
  long local_d0 [2];
  long *local_c0 [2];
  long local_b0 [2];
  undefined2 local_a0;
  undefined1 local_98 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  _Alloc_hider local_68;
  size_type local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  text._M_str = "/**\n";
  text._M_len = 4;
  io::Printer::Print<>((Printer *)this,text);
  uVar5 = *(undefined2 *)&service->field_0x4;
  uVar4 = *(undefined4 *)service;
  puVar6 = &stack0xfffffffffffffee0;
  pcVar1 = (service->all_names_).payload_;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&stack0xfffffffffffffed0,pcVar1,
             pcVar1 + (long)&service->file_->super_SymbolBase);
  puVar7 = &stack0xffffffffffffff00;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&stack0xfffffffffffffef0,service->merged_features_,
             &service->methods_->super_SymbolBase +
             (long)&(service->merged_features_->super_Message).super_MessageLite);
  uVar8 = *(undefined2 *)&service[1].all_names_.payload_;
  local_98._24_8_ = 0;
  local_78._M_local_buf[0] = '\0';
  local_60 = 0;
  local_58._M_local_buf[0] = '\0';
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98._16_8_ = &local_78;
  local_68._M_p = (pointer)&local_58;
  bVar3 = ServiceDescriptor::GetSourceLocation
                    ((ServiceDescriptor *)printer,(SourceLocation *)local_98);
  if (bVar3) {
    local_e0[0] = local_d0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_e0,puVar6,puVar6 + in_stack_fffffffffffffed8);
    local_c0[0] = local_b0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_c0,puVar7,puVar7 + in_stack_fffffffffffffef8);
    options = (Options *)0x0;
    options_00.opensource_runtime = (bool)(char)uVar5;
    options_00.annotate_code = (bool)(char)((ushort)uVar5 >> 8);
    options_00.generate_immutable_code = (bool)(char)uVar4;
    options_00.generate_mutable_code = (bool)(char)((uint)uVar4 >> 8);
    options_00.generate_shared_code = (bool)(char)((uint)uVar4 >> 0x10);
    options_00.enforce_lite = (bool)(char)((uint)uVar4 >> 0x18);
    options_00._6_2_ = in_stack_fffffffffffffece;
    options_00.annotation_list_file._M_dataplus._M_p = puVar6;
    options_00.annotation_list_file._M_string_length = in_stack_fffffffffffffed8;
    options_00.annotation_list_file.field_2._M_allocated_capacity = in_stack_fffffffffffffee0;
    options_00.annotation_list_file.field_2._8_8_ = in_stack_fffffffffffffee8;
    options_00.output_list_file._M_dataplus._M_p = puVar7;
    options_00.output_list_file._M_string_length = in_stack_fffffffffffffef8;
    options_00.output_list_file.field_2._M_allocated_capacity = in_stack_ffffffffffffff00;
    options_00.output_list_file.field_2._8_8_ = in_stack_ffffffffffffff08;
    options_00.strip_nonfunctional_codegen = (bool)(char)uVar8;
    options_00.jvm_dsl = (bool)(char)((ushort)uVar8 >> 8);
    options_00._74_2_ = in_stack_ffffffffffffff12;
    options_00._76_4_ = in_stack_ffffffffffffff14;
    local_a0 = uVar8;
    WriteDocCommentBodyForLocation
              ((Printer *)this,(SourceLocation *)local_98,options_00,SUB21(uVar8,0));
    if (local_c0[0] != local_b0) {
      operator_delete(local_c0[0],local_b0[0] + 1);
    }
    if (local_e0[0] != local_d0) {
      operator_delete(local_e0[0],local_d0[0] + 1);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_p != &local_58) {
    operator_delete(local_68._M_p,
                    CONCAT71(local_58._M_allocated_capacity._1_7_,local_58._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._16_8_ != &local_78) {
    operator_delete((void *)local_98._16_8_,
                    CONCAT71(local_78._M_allocated_capacity._1_7_,local_78._M_local_buf[0]) + 1);
  }
  if (puVar7 != &stack0xffffffffffffff00) {
    operator_delete(puVar7,in_stack_ffffffffffffff00 + 1);
  }
  if (puVar6 != &stack0xfffffffffffffee0) {
    operator_delete(puVar6,in_stack_fffffffffffffee0 + 1);
  }
  pvVar2 = (printer->sink_).buffer_;
  this_00 = (java *)(ulong)*(ushort *)((long)pvVar2 + 2);
  input._M_len = ~(ulong)this_00 + (long)pvVar2;
  input._M_str = &options->generate_immutable_code;
  EscapeJavadoc_abi_cxx11_((string *)local_98,this_00,input);
  text_00._M_str = " * Protobuf service {@code $fullname$}\n */\n";
  text_00._M_len = 0x2b;
  io::Printer::Print<char[9],std::__cxx11::string>
            ((Printer *)this,text_00,(char (*) [9])"fullname",(string *)local_98);
  if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
    operator_delete((void *)local_98._0_8_,(ulong)(local_98._16_8_ + 1));
  }
  return;
}

Assistant:

void WriteServiceDocComment(io::Printer* printer,
                            const ServiceDescriptor* service,
                            const Options options) {
  printer->Print("/**\n");
  WriteDocCommentBody(printer, service, options, /* kdoc */ false);
  printer->Print(
      " * Protobuf service {@code $fullname$}\n"
      " */\n",
      "fullname", EscapeJavadoc(service->full_name()));
}